

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skeletal_mesh.h
# Opt level: O0

void __thiscall SkeletalMesh::Scene::render(Scene *this)

{
  uint uVar1;
  PFNGLDRAWELEMENTSBASEVERTEXPROC p_Var2;
  uint uVar3;
  size_type sVar4;
  const_reference pvVar5;
  const_reference pvVar6;
  socklen_t __len;
  sockaddr *__addr;
  int local_14;
  int i;
  Scene *this_local;
  
  if ((this->available & 1U) != 0) {
    (*__glewBindVertexArray)(this->vao);
    for (local_14 = 0;
        sVar4 = std::vector<SkeletalMesh::MeshEntry,_std::allocator<SkeletalMesh::MeshEntry>_>::size
                          (&this->meshEntry), (ulong)(long)local_14 < sVar4; local_14 = local_14 + 1
        ) {
      pvVar5 = std::vector<SkeletalMesh::MeshEntry,_std::allocator<SkeletalMesh::MeshEntry>_>::
               operator[](&this->meshEntry,(long)local_14);
      __len = (socklen_t)sVar4;
      pvVar6 = std::vector<SkeletalMesh::Material,_std::allocator<SkeletalMesh::Material>_>::
               operator[](&this->material,(ulong)pvVar5->materialIndex);
      uVar3 = TextureImage::Texture::bind(pvVar6->diffuse,0,__addr,__len);
      if ((uVar3 & 1) == 0) {
        glBindTexture(0xde1,0);
      }
      p_Var2 = __glewDrawElementsBaseVertex;
      pvVar5 = std::vector<SkeletalMesh::MeshEntry,_std::allocator<SkeletalMesh::MeshEntry>_>::
               operator[](&this->meshEntry,(long)local_14);
      uVar3 = pvVar5->facetCornerNum;
      pvVar5 = std::vector<SkeletalMesh::MeshEntry,_std::allocator<SkeletalMesh::MeshEntry>_>::
               operator[](&this->meshEntry,(long)local_14);
      uVar1 = pvVar5->indexOffset;
      pvVar5 = std::vector<SkeletalMesh::MeshEntry,_std::allocator<SkeletalMesh::MeshEntry>_>::
               operator[](&this->meshEntry,(long)local_14);
      (*p_Var2)(4,uVar3,0x1405,(void *)((ulong)uVar1 << 2),pvVar5->vertexOffset);
    }
    (*__glewBindVertexArray)(0);
  }
  return;
}

Assistant:

void render() const {
            if (!available) return;
            glBindVertexArray(vao);
            for (int i = 0; i < meshEntry.size(); i++) {
                if (!material[meshEntry[i].materialIndex].diffuse->bind(
                        SCENE_RESOURCE_SHADER_DIFFUSE_CHANNEL))
                    glBindTexture(GL_TEXTURE_2D, 0);

                glDrawElementsBaseVertex(GL_TRIANGLES,
                                         meshEntry[i].facetCornerNum,
                                         GL_UNSIGNED_INT,
                                         (void *) (sizeof(unsigned int) * meshEntry[i].indexOffset),
                                         meshEntry[i].vertexOffset);
            }
            glBindVertexArray(0);
        }